

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O3

bool URL::HasInsecureProtocol(char *in,int inlen)

{
  bool bVar1;
  int iVar2;
  
  if ((uint)inlen < 8) {
    if (inlen == 7) goto LAB_0012a735;
LAB_0012a74d:
    bVar1 = true;
  }
  else {
    iVar2 = strncasecmp(in,"http://",7);
    if ((iVar2 != 0) && ((inlen == 8 || (iVar2 = strncasecmp(in,"https://",8), iVar2 != 0)))) {
LAB_0012a735:
      iVar2 = strncasecmp(in,"ftp://",6);
      if (iVar2 != 0) goto LAB_0012a74d;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HasInsecureProtocol(const char* in, int inlen) {
  if (inlen > strliterallen("http://") &&
      strncasecmp(in, "http://", strliterallen("http://")) == 0) {
    return false;  // We're ok, it's an http protocol
  }
  if (inlen > strliterallen("https://") &&
      strncasecmp(in, "https://", strliterallen("https://")) == 0) {
    return false;  // https is ok as well
  }
  if (inlen > strliterallen("ftp://") &&
      strncasecmp(in, "ftp://", strliterallen("ftp://")) == 0) {
    return false;  // and ftp
  }
  return true;
}